

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtrBasic.c
# Opt level: O2

MtrNode * Mtr_CreateLastChild(MtrNode *parent)

{
  MtrNode *child;
  
  child = Mtr_AllocNode();
  if (child != (MtrNode *)0x0) {
    child->flags = 0;
    child->child = (MtrNode *)0x0;
    child->elder = (MtrNode *)0x0;
    child->younger = (MtrNode *)0x0;
    Mtr_MakeLastChild(parent,child);
  }
  return child;
}

Assistant:

MtrNode *
Mtr_CreateLastChild(
  MtrNode * parent)
{
    MtrNode *child;

    child = Mtr_AllocNode();
    if (child == NULL) return(NULL);

    child->child = child->younger = child->elder = NULL;
    child->flags = 0;
    Mtr_MakeLastChild(parent,child);
    return(child);

}